

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

void htmlAttrDumpOutput(xmlOutputBufferPtr buf,xmlDocPtr doc,xmlAttrPtr cur)

{
  int iVar1;
  byte *string;
  xmlChar *pxVar2;
  byte *str;
  long lVar3;
  
  if (cur != (xmlAttrPtr)0x0) {
    xmlOutputBufferWriteString(buf," ");
    if ((cur->ns != (xmlNs *)0x0) && (pxVar2 = cur->ns->prefix, pxVar2 != (xmlChar *)0x0)) {
      xmlOutputBufferWriteString(buf,(char *)pxVar2);
      xmlOutputBufferWriteString(buf,":");
    }
    xmlOutputBufferWriteString(buf,(char *)cur->name);
    if (cur->children != (_xmlNode *)0x0) {
      pxVar2 = cur->name;
      lVar3 = 0;
      do {
        iVar1 = xmlStrcasecmp(*(xmlChar **)((long)htmlBooleanAttrs + lVar3),pxVar2);
        if (iVar1 == 0) {
          return;
        }
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x68);
      string = xmlNodeListGetString(doc,cur->children,0);
      if (string != (byte *)0x0) {
        xmlOutputBufferWriteString(buf,"=");
        if ((((cur->ns == (xmlNs *)0x0) && (cur->parent != (_xmlNode *)0x0)) &&
            (cur->parent->ns == (xmlNs *)0x0)) &&
           (((iVar1 = xmlStrcasecmp(cur->name,"href"), str = string, iVar1 == 0 ||
             (iVar1 = xmlStrcasecmp(cur->name,(xmlChar *)"action"), iVar1 == 0)) ||
            ((iVar1 = xmlStrcasecmp(cur->name,(xmlChar *)"src"), iVar1 == 0 ||
             ((iVar1 = xmlStrcasecmp(cur->name,"name"), iVar1 == 0 &&
              (iVar1 = xmlStrcasecmp(cur->parent->name,"a"), iVar1 == 0)))))))) {
          while (((ulong)*str < 0x21 && ((0x100002600U >> ((ulong)*str & 0x3f) & 1) != 0))) {
            str = str + 1;
          }
          pxVar2 = xmlURIEscapeStr(str,(xmlChar *)"\"#$%&+,/:;<=>?@[\\]^`{|}");
          if (pxVar2 == (xmlChar *)0x0) {
            buf->error = 2;
          }
          else {
            xmlOutputBufferWriteQuotedString(buf,pxVar2);
            (*xmlFree)(pxVar2);
          }
        }
        else {
          xmlOutputBufferWriteQuotedString(buf,string);
        }
        (*xmlFree)(string);
        return;
      }
      buf->error = 2;
    }
  }
  return;
}

Assistant:

static void
htmlAttrDumpOutput(xmlOutputBufferPtr buf, xmlDocPtr doc, xmlAttrPtr cur) {
    xmlChar *value;

    /*
     * The html output method should not escape a & character
     * occurring in an attribute value immediately followed by
     * a { character (see Section B.7.1 of the HTML 4.0 Recommendation).
     * This is implemented in xmlEncodeEntitiesReentrant
     */

    if (cur == NULL) {
	return;
    }
    xmlOutputBufferWriteString(buf, " ");
    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
        xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
	xmlOutputBufferWriteString(buf, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *)cur->name);
    if ((cur->children != NULL) && (!htmlIsBooleanAttr(cur->name))) {
	value = xmlNodeListGetString(doc, cur->children, 0);
	if (value) {
	    xmlOutputBufferWriteString(buf, "=");
	    if ((cur->ns == NULL) && (cur->parent != NULL) &&
		(cur->parent->ns == NULL) &&
		((!xmlStrcasecmp(cur->name, BAD_CAST "href")) ||
	         (!xmlStrcasecmp(cur->name, BAD_CAST "action")) ||
		 (!xmlStrcasecmp(cur->name, BAD_CAST "src")) ||
		 ((!xmlStrcasecmp(cur->name, BAD_CAST "name")) &&
		  (!xmlStrcasecmp(cur->parent->name, BAD_CAST "a"))))) {
		xmlChar *escaped;
		xmlChar *tmp = value;

		while (IS_BLANK_CH(*tmp)) tmp++;

		/*
                 * Angle brackets are technically illegal in URIs, but they're
                 * used in server side includes, for example. Curly brackets
                 * are illegal as well and often used in templates.
                 * Don't escape non-whitespace, printable ASCII chars for
                 * improved interoperability. Only escape space, control
                 * and non-ASCII chars.
		 */
		escaped = xmlURIEscapeStr(tmp,
                        BAD_CAST "\"#$%&+,/:;<=>?@[\\]^`{|}");
		if (escaped != NULL) {
		    xmlOutputBufferWriteQuotedString(buf, escaped);
		    xmlFree(escaped);
		} else {
                    buf->error = XML_ERR_NO_MEMORY;
		}
	    } else {
		xmlOutputBufferWriteQuotedString(buf, value);
	    }
	    xmlFree(value);
	} else  {
            buf->error = XML_ERR_NO_MEMORY;
	}
    }
}